

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O0

void strprepProfileLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *local_100;
  char *s;
  char *filename;
  uint32_t rangeEnd;
  uint32_t rangeStart;
  char *typeName;
  int32_t length;
  uint32_t code;
  char *map;
  char *end;
  uint32_t mapping [40];
  UErrorCode *pErrorCode_local;
  int32_t fieldCount_local;
  char *(*fields_local) [2];
  void *context_local;
  
  filename._4_4_ = 0;
  filename._0_4_ = 0;
  mapping._152_8_ = pErrorCode;
  local_100 = u_skipWhitespace((*fields)[0]);
  if (*local_100 == '@') {
    local_100 = local_100 + 1;
    typeName._0_4_ = (int)(*fields)[1] - (int)local_100;
    if ((8 < (int32_t)typeName) && (iVar3 = strncmp(local_100,"normalize",9), iVar3 == 0)) {
      options[8].doesOccur = '\x01';
      return;
    }
    if ((9 < (int32_t)typeName) && (iVar3 = strncmp(local_100,"check-bidi",10), iVar3 == 0)) {
      options[10].doesOccur = '\x01';
      return;
    }
    fprintf(_stderr,"gensprep error parsing a directive %s.",(*fields)[0]);
  }
  _rangeEnd = fields[2][0];
  _length = fields[1][0];
  pcVar4 = strstr(_rangeEnd,usprepTypeNames[0]);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strstr(_rangeEnd,usprepTypeNames[2]);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strstr(_rangeEnd,usprepTypeNames[1]);
      if (pcVar4 == (char *)0x0) {
        *(undefined4 *)mapping._152_8_ = 3;
      }
      else {
        uVar5 = strtoul(local_100,&map,0x10);
        typeName._4_4_ = (uint32_t)uVar5;
        if ((map <= local_100) || (map != (*fields)[1])) {
          fprintf(_stderr,"gensprep: syntax error in field 0 at %s\n",(*fields)[0]);
          *(undefined4 *)mapping._152_8_ = 9;
          exit(9);
        }
        typeName._0_4_ =
             u_parseCodePoints(_length,(uint32_t *)&end,0x28,(UErrorCode *)mapping._152_8_);
        storeMapping(typeName._4_4_,(uint32_t *)&end,(int32_t)typeName,USPREP_MAP,
                     (UErrorCode *)mapping._152_8_);
      }
    }
    else {
      u_parseCodePointRange
                (local_100,(uint32_t *)((long)&filename + 4),(uint32_t *)&filename,
                 (UErrorCode *)mapping._152_8_);
      pFVar2 = _stderr;
      if (0 < *(int *)mapping._152_8_) {
        pcVar4 = u_errorName_63(*(UErrorCode *)mapping._152_8_);
        fprintf(pFVar2,"Could not parse code point range. Error: %s\n",pcVar4);
        return;
      }
      storeRange(filename._4_4_,(uint32_t)filename,USPREP_PROHIBITED,(UErrorCode *)mapping._152_8_);
    }
  }
  else {
    u_parseCodePointRange
              (local_100,(uint32_t *)((long)&filename + 4),(uint32_t *)&filename,
               (UErrorCode *)mapping._152_8_);
    pFVar2 = _stderr;
    if (0 < *(int *)mapping._152_8_) {
      pcVar4 = u_errorName_63(*(UErrorCode *)mapping._152_8_);
      fprintf(pFVar2,"Could not parse code point range. Error: %s\n",pcVar4);
      return;
    }
    storeRange(filename._4_4_,(uint32_t)filename,USPREP_UNASSIGNED,(UErrorCode *)mapping._152_8_);
  }
  pFVar2 = _stderr;
  if (*(int *)mapping._152_8_ < 1) {
    return;
  }
  pcVar4 = (*fields)[0];
  pcVar1 = fields[2][0];
  pcVar6 = u_errorName_63(*(UErrorCode *)mapping._152_8_);
  fprintf(pFVar2,"gensprep error parsing  %s line %s at %s. Error: %s\n",context,pcVar4,pcVar1,
          pcVar6);
  exit(*(int *)mapping._152_8_);
}

Assistant:

static void U_CALLCONV
strprepProfileLineFn(void *context,
              char *fields[][2], int32_t fieldCount,
              UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *map;
    uint32_t code;
    int32_t length;
   /*UBool* mapWithNorm = (UBool*) context;*/
    const char* typeName;
    uint32_t rangeStart=0,rangeEnd =0;
    const char* filename = (const char*) context;
    const char *s;

    s = u_skipWhitespace(fields[0][0]);
    if (*s == '@') {
        /* special directive */
        s++;
        length = (int32_t)(fields[0][1] - s);
        if (length >= NORMALIZE_DIRECTIVE_LEN
            && uprv_strncmp(s, NORMALIZE_DIRECTIVE, NORMALIZE_DIRECTIVE_LEN) == 0) {
            options[NORMALIZE].doesOccur = TRUE;
            return;
        }
        else if (length >= CHECK_BIDI_DIRECTIVE_LEN
            && uprv_strncmp(s, CHECK_BIDI_DIRECTIVE, CHECK_BIDI_DIRECTIVE_LEN) == 0) {
            options[CHECK_BIDI].doesOccur = TRUE;
            return;
        }
        else {
            fprintf(stderr, "gensprep error parsing a directive %s.", fields[0][0]);
        }
    }

    typeName = fields[2][0];
    map = fields[1][0];

    if(uprv_strstr(typeName, usprepTypeNames[USPREP_UNASSIGNED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_UNASSIGNED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_PROHIBITED])!=NULL){

        u_parseCodePointRange(s, &rangeStart,&rangeEnd, pErrorCode);
        if(U_FAILURE(*pErrorCode)){
            fprintf(stderr, "Could not parse code point range. Error: %s\n",u_errorName(*pErrorCode));
            return;
        }

        /* store the range */
        storeRange(rangeStart,rangeEnd,USPREP_PROHIBITED, pErrorCode);

    }else if(uprv_strstr(typeName, usprepTypeNames[USPREP_MAP])!=NULL){

        /* get the character code, field 0 */
        code=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || end!=fields[0][1]) {
            fprintf(stderr, "gensprep: syntax error in field 0 at %s\n", fields[0][0]);
            *pErrorCode=U_PARSE_ERROR;
            exit(U_PARSE_ERROR);
        }

        /* parse the mapping string */
        length=u_parseCodePoints(map, mapping, sizeof(mapping)/4, pErrorCode);
        
        /* store the mapping */
        storeMapping(code,mapping, length,USPREP_MAP, pErrorCode);

    }else{
        *pErrorCode = U_INVALID_FORMAT_ERROR;
    }
    
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing  %s line %s at %s. Error: %s\n",filename,
               fields[0][0],fields[2][0],u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

}